

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelAggregates,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcRelAggregates *in;
  
  in = (IfcRelAggregates *)operator_new(0xf0);
  *(undefined ***)&(in->super_IfcRelDecomposes).field_0xd8 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0xe0 = 0;
  *(char **)&in->field_0xe8 = "IfcRelAggregates";
  Assimp::IFC::Schema_2x3::IfcRelDecomposes::IfcRelDecomposes
            ((IfcRelDecomposes *)in,&PTR_construction_vtable_24__008a4a48);
  *(undefined ***)&in->super_IfcRelDecomposes = &PTR__IfcRelAggregates_008a4990;
  *(undefined ***)&(in->super_IfcRelDecomposes).field_0xd8 = &PTR__IfcRelAggregates_008a4a30;
  *(undefined ***)&(in->super_IfcRelDecomposes).field_0x88 = &PTR__IfcRelAggregates_008a49b8;
  (in->super_IfcRelDecomposes).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcRelAggregates_008a49e0;
  *(undefined ***)&(in->super_IfcRelDecomposes).field_0xc8 = &PTR__IfcRelAggregates_008a4a08;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRelAggregates>(db,params,in);
  return (Object *)
         (&(in->super_IfcRelDecomposes).field_0x0 +
         *(long *)(*(long *)&in->super_IfcRelDecomposes + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }